

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

vector<CService,_std::allocator<CService>_> *
Lookup(string *name,uint16_t portDefault,bool fAllowLookup,uint nMaxSolutions,
      DNSLookupFn *dns_lookup_function)

{
  string_view str;
  string_view in;
  bool bVar1;
  undefined1 in_CL;
  string *in_RDI;
  undefined4 in_R8D;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  __sv_type _Var2;
  CNetAddr *addr;
  vector<CNetAddr,_std::allocator<CNetAddr>_> *__range1;
  vector<CService,_std::allocator<CService>_> *services;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CNetAddr,_std::allocator<CNetAddr>_> addresses;
  uint16_t port;
  string hostname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  vector<CNetAddr,_std::allocator<CNetAddr>_> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffefc;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *hostOut;
  uint16_t *in_stack_ffffffffffffff20;
  vector<CService,_std::allocator<CService>_> *in_stack_ffffffffffffff28;
  char *pcVar4;
  DNSLookupFn *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffbb;
  uint in_stack_ffffffffffffffbc;
  string *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  hostOut = in_RDI;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (in_stack_fffffffffffffee8);
  if (!bVar1) {
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(in_R9);
    pcVar4 = (char *)_Var2._M_len;
    str._M_str = (char *)hostOut;
    str._M_len = (size_t)in_RDI;
    bVar1 = util::ContainsNoNUL(str);
    if (bVar1) {
      this = &local_28;
      std::__cxx11::string::string(this);
      _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(in_R9);
      in._M_str = pcVar4;
      in._M_len = (size_t)_Var2._M_str;
      SplitHostPort(in,in_stack_ffffffffffffff20,hostOut);
      uVar3 = CONCAT13(in_CL,(int3)in_stack_fffffffffffffefc) & 0x1ffffff;
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                  *)in_R9,(function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                           *)this);
      LookupIntern(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                   (bool)in_stack_ffffffffffffffbb,in_stack_ffffffffffffffb0);
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                   *)in_stack_fffffffffffffee8);
      bVar1 = std::vector<CNetAddr,_std::allocator<CNetAddr>_>::empty
                        ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)CONCAT44(uVar3,in_R8D));
      if (bVar1) {
        memset(in_RDI,0,0x18);
        std::vector<CService,_std::allocator<CService>_>::vector
                  ((vector<CService,_std::allocator<CService>_> *)in_stack_fffffffffffffee8);
      }
      else {
        std::vector<CService,_std::allocator<CService>_>::vector
                  ((vector<CService,_std::allocator<CService>_> *)in_stack_fffffffffffffee8);
        std::vector<CNetAddr,_std::allocator<CNetAddr>_>::size
                  ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_fffffffffffffee8);
        std::vector<CService,_std::allocator<CService>_>::reserve
                  (in_stack_ffffffffffffff28,(size_type)in_stack_ffffffffffffff20);
        std::vector<CNetAddr,_std::allocator<CNetAddr>_>::begin(in_stack_fffffffffffffef0);
        std::vector<CNetAddr,_std::allocator<CNetAddr>_>::end(in_stack_fffffffffffffef0);
        while (bVar1 = __gnu_cxx::
                       operator==<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                                 ((__normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                                   *)CONCAT44(uVar3,in_R8D),
                                  (__normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                                   *)in_stack_fffffffffffffef0), ((bVar1 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>::
          operator*((__normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                     *)in_stack_fffffffffffffee8);
          std::vector<CService,std::allocator<CService>>::
          emplace_back<CNetAddr_const&,unsigned_short&>
                    ((vector<CService,_std::allocator<CService>_> *)in_R9,(CNetAddr *)this,
                     (unsigned_short *)CONCAT44(uVar3,in_R8D));
          __gnu_cxx::
          __normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>::
          operator++((__normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                      *)in_stack_fffffffffffffee8);
        }
      }
      std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector
                ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)CONCAT44(uVar3,in_R8D));
      std::__cxx11::string::~string(in_stack_fffffffffffffee8);
      goto LAB_01986dbb;
    }
  }
  memset(in_RDI,0,0x18);
  std::vector<CService,_std::allocator<CService>_>::vector
            ((vector<CService,_std::allocator<CService>_> *)in_stack_fffffffffffffee8);
LAB_01986dbb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (vector<CService,_std::allocator<CService>_> *)hostOut;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CService> Lookup(const std::string& name, uint16_t portDefault, bool fAllowLookup, unsigned int nMaxSolutions, DNSLookupFn dns_lookup_function)
{
    if (name.empty() || !ContainsNoNUL(name)) {
        return {};
    }
    uint16_t port{portDefault};
    std::string hostname;
    SplitHostPort(name, port, hostname);

    const std::vector<CNetAddr> addresses{LookupIntern(hostname, nMaxSolutions, fAllowLookup, dns_lookup_function)};
    if (addresses.empty()) return {};
    std::vector<CService> services;
    services.reserve(addresses.size());
    for (const auto& addr : addresses)
        services.emplace_back(addr, port);
    return services;
}